

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

MemberSyntax * __thiscall slang::parsing::Parser::parseClockingItem(Parser *this)

{
  SyntaxFactory *this_00;
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  ClockingSkewSyntax *inputSkew;
  ClockingSkewSyntax *outputSkew;
  ClockingDirectionSyntax *direction;
  DefaultSkewItemSyntax *pDVar4;
  MemberSyntax *pMVar5;
  AttributeSpecSyntax *pAVar6;
  undefined4 extraout_var;
  ClockingItemSyntax *pCVar7;
  uint uVar8;
  Info *src;
  Info *extraout_RDX;
  Token TVar9;
  string_view sVar10;
  Token TVar11;
  Token local_158;
  Token local_148;
  Token local_138;
  Token semi;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_118;
  uint local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  Token local_e8;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> local_d8;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> decls;
  
  Token::Token(&local_148);
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  uVar8 = TVar9.kind - 0xc2;
  if ((0x26 < uVar8) || ((0x4000000003U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) {
    if (TVar9.kind != DefaultKeyword) {
      pMVar5 = parseSingleMember(this,ClockingItem);
      return pMVar5;
    }
    local_148 = ParserBase::consume(&this->super_ParserBase);
  }
  Token::Token(&local_158);
  Token::Token(&local_138);
  bVar1 = ParserBase::peek(&this->super_ParserBase,InOutKeyword);
  if (bVar1) {
    local_158 = ParserBase::consume(&this->super_ParserBase);
    if (local_148.info != (Info *)0x0) {
      SVar3 = Token::location(&local_158);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4d0005,SVar3);
    }
    outputSkew = (ClockingSkewSyntax *)0x0;
    inputSkew = (ClockingSkewSyntax *)0x0;
  }
  else {
    bVar1 = ParserBase::peek(&this->super_ParserBase,InputKeyword);
    if (bVar1) {
      local_158 = ParserBase::consume(&this->super_ParserBase);
      inputSkew = parseClockingSkew(this);
      if ((inputSkew == (ClockingSkewSyntax *)0x0) && (local_148.info != (Info *)0x0)) {
        SVar3 = Token::location(&local_158);
        sVar10 = Token::rawText(&local_158);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x230005,
                            (SourceLocation)((long)SVar3 + sVar10._M_len * 0x10000000));
        goto LAB_002bfc60;
      }
    }
    else {
LAB_002bfc60:
      inputSkew = (ClockingSkewSyntax *)0x0;
    }
    bVar1 = ParserBase::peek(&this->super_ParserBase,OutputKeyword);
    if (bVar1) {
      local_138 = ParserBase::consume(&this->super_ParserBase);
      outputSkew = parseClockingSkew(this);
      if ((outputSkew == (ClockingSkewSyntax *)0x0) && (local_148.info != (Info *)0x0)) {
        SVar3 = Token::location(&local_138);
        sVar10 = Token::rawText(&local_138);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x230005,
                            (SourceLocation)((long)SVar3 + sVar10._M_len * 0x10000000));
        goto LAB_002bfccd;
      }
    }
    else {
LAB_002bfccd:
      outputSkew = (ClockingSkewSyntax *)0x0;
    }
    if (((local_148.info != (Info *)0x0) && (local_158.info == (Info *)0x0)) &&
       (local_138.info == (Info *)0x0)) {
      SVar3 = Token::location(&local_148);
      sVar10 = Token::valueText(&local_148);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x230005,
                          (SourceLocation)((long)SVar3 + sVar10._M_len * 0x10000000));
    }
  }
  this_00 = &this->factory;
  direction = slang::syntax::SyntaxFactory::clockingDirection
                        (this_00,local_158,inputSkew,local_138,outputSkew);
  TVar9 = local_148;
  if (local_148.info != (Info *)0x0) {
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap =
         CONCAT44(decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap._4_4_,1);
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x10] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x11] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x12] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x13] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x14] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x15] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x16] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0x17] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[8] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[9] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[10] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xb] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xc] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xd] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xe] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xf] = '\0';
    decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
         (pointer)&PTR_getChild_004703a8;
    local_e8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pDVar4 = slang::syntax::SyntaxFactory::defaultSkewItem
                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&decls,TVar9,
                        direction,local_e8);
    return &pDVar4->super_MemberSyntax;
  }
  Token::Token(&semi);
  decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  local_d8.super_SyntaxListBase._0_16_ = TVar9;
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar9.kind);
  if (bVar1) {
    SVar3 = Token::location((Token *)&local_d8);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x310005,SVar3);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(TVar9.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar9,Semicolon,&semi,(DiagCode)0x310005);
      src = extraout_RDX;
      goto LAB_002bff64;
    }
    do {
      TVar9 = ParserBase::peek(&this->super_ParserBase);
      pAVar6 = parseAttributeSpec(this);
      local_118._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pAVar6;
      local_108 = CONCAT31(local_108._1_3_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_118._M_first);
      TVar11 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar11.kind);
      if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,Comma), !bVar1)) break;
      local_118._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           ParserBase::expect(&this->super_ParserBase,Comma);
      local_108 = local_108 & 0xffffff00;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_118._M_first);
      TVar11 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar11.kind);
      if (bVar1) {
        ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
        break;
      }
      TVar11 = ParserBase::peek(&this->super_ParserBase);
    } while ((TVar9.info != TVar11.info || TVar9.kind != TVar11.kind) ||
            (bVar1 = ParserBase::
                     skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                               (&this->super_ParserBase,(DiagCode)0x310005,true), bVar1));
  }
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  src = semi.info;
LAB_002bff64:
  local_108 = 1;
  local_f0 = 0;
  local_100 = 0;
  uStack_f8 = 0;
  local_118 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
              ZEXT816(0x4703a8);
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_d8.elements.data_ = (pointer)CONCAT44(extraout_var,iVar2);
  local_d8.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_d8.super_SyntaxListBase._0_16_ = ZEXT816(0x472e00);
  pCVar7 = slang::syntax::SyntaxFactory::clockingItem
                     (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                              &local_118._M_first,direction,&local_d8,semi);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::~SmallVectorBase
            (&decls.super_SmallVectorBase<slang::syntax::TokenOrSyntax>);
  return &pCVar7->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseClockingItem() {
    Token def;
    switch (peek().kind) {
        case TokenKind::DefaultKeyword:
            def = consume();
            break;
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
            break;
        default:
            return parseSingleMember(SyntaxKind::ClockingItem);
    }

    Token input, output;
    ClockingSkewSyntax* inputSkew = nullptr;
    ClockingSkewSyntax* outputSkew = nullptr;
    if (peek(TokenKind::InOutKeyword)) {
        input = consume();
        if (def)
            addDiag(diag::InOutDefaultSkew, input.location());
    }
    else {
        if (peek(TokenKind::InputKeyword)) {
            input = consume();
            inputSkew = parseClockingSkew();
            if (def && !inputSkew)
                addDiag(diag::ExpectedClockingSkew, input.location() + input.rawText().length());
        }

        if (peek(TokenKind::OutputKeyword)) {
            output = consume();
            outputSkew = parseClockingSkew();
            if (def && !outputSkew)
                addDiag(diag::ExpectedClockingSkew, output.location() + output.rawText().length());
        }

        if (def && !input && !output)
            addDiag(diag::ExpectedClockingSkew, def.location() + def.valueText().length());
    }

    auto& direction = factory.clockingDirection(input, inputSkew, output, outputSkew);
    if (def)
        return &factory.defaultSkewItem(nullptr, def, direction, expect(TokenKind::Semicolon));

    Token semi;
    SmallVector<TokenOrSyntax, 4> decls;
    parseList<isIdentifierOrComma, isSemicolon>(decls, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedIdentifier,
                                                [this] { return &parseAttributeSpec(); });

    return &factory.clockingItem(nullptr, direction, decls.copy(alloc), semi);
}